

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

base_learner * cb_explore_adf_setup(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  float fVar3;
  vw *all_00;
  float *pfVar4;
  undefined8 uVar5;
  int iVar6;
  cb_explore_adf *pcVar7;
  _func_int ***__dest;
  option_group_definition *poVar8;
  typed_option<float> *ptVar9;
  base_learner *l;
  multi_learner *base;
  multi_learner *pmVar10;
  learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
  *plVar11;
  long lVar12;
  char cVar13;
  undefined **ppuVar14;
  label_parser *plVar15;
  size_t ws;
  byte bVar16;
  bool regcb;
  bool softmax;
  bool cb_explore_adf_option;
  string type_string;
  size_type __dnew;
  size_type __dnew_17;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew_16;
  size_type __dnew_14;
  size_type __dnew_11;
  size_type __dnew_9;
  size_type __dnew_8;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_15;
  size_type __dnew_13;
  size_type __dnew_12;
  size_type __dnew_10;
  size_type __dnew_5;
  bool local_1a63;
  bool local_1a62;
  bool local_1a61;
  options_i *local_1a60;
  cb_explore_adf *local_1a58;
  vw *local_1a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a48;
  undefined1 local_1a28 [112];
  bool local_19b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_19a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1990;
  _func_int ***local_1988;
  _func_int **local_1980;
  _func_int **local_1978 [2];
  float *local_1968;
  bool *local_1960;
  float *local_1958;
  long local_1950;
  _func_int ***local_1948;
  _func_int **local_1940;
  _func_int **local_1938 [2];
  _func_int ***local_1928;
  _func_int **local_1920;
  _func_int **local_1918 [2];
  _func_int ***local_1908;
  _func_int **local_1900;
  _func_int **local_18f8 [2];
  _func_int ***local_18e8;
  _func_int **local_18e0;
  _func_int **local_18d8 [2];
  _func_int ***local_18c8;
  _func_int **local_18c0;
  _func_int **local_18b8 [2];
  _func_int ***local_18a8;
  _func_int **local_18a0;
  _func_int **local_1898 [2];
  _func_int ***local_1888;
  _func_int **local_1880;
  _func_int **local_1878 [2];
  _func_int ***local_1868;
  _func_int **local_1860;
  _func_int **local_1858 [2];
  _func_int ***local_1848;
  _func_int **local_1840;
  _func_int **local_1838 [2];
  _func_int ***local_1828;
  _func_int **local_1820;
  _func_int **local_1818 [2];
  _func_int ***local_1808;
  _func_int **local_1800;
  _func_int **local_17f8 [2];
  _func_int ***local_17e8;
  _func_int **local_17e0;
  _func_int **local_17d8 [2];
  _func_int ***local_17c8;
  _func_int **local_17c0;
  _func_int **local_17b8 [2];
  _func_int ***local_17a8;
  _func_int **local_17a0;
  _func_int **local_1798 [2];
  string local_1788;
  string local_1768;
  string local_1748;
  string local_1728;
  string local_1708;
  string local_16e8;
  string local_16c8;
  string local_16a8;
  string local_1688;
  string local_1668;
  string local_1648;
  string local_1628;
  string local_1608;
  string local_15e8;
  string local_15c8;
  option_group_definition local_15a8;
  long *local_1570;
  long local_1568;
  long local_1560 [2];
  _func_int ***local_1550;
  _func_int **local_1548;
  _func_int **local_1540 [2];
  _func_int ***local_1530;
  _func_int **local_1528;
  _func_int **local_1520 [2];
  string local_1510;
  string local_14f0;
  undefined1 local_14d0 [112];
  bool local_1460;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1448;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1438;
  undefined1 local_1430 [112];
  bool local_13c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_13a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1398;
  undefined1 local_1390 [112];
  bool local_1320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_12f8;
  undefined1 local_12f0 [112];
  bool local_1280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1258;
  undefined1 local_1250 [112];
  bool local_11e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11b8;
  undefined1 local_11b0 [112];
  bool local_1140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1118;
  undefined1 local_1110 [112];
  bool local_10a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1088;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1078;
  undefined1 local_1070 [112];
  bool local_1000;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fe8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fd8;
  undefined1 local_fd0 [112];
  bool local_f60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f38;
  undefined1 local_f30 [112];
  bool local_ec0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e98;
  undefined1 local_e90 [112];
  bool local_e20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_df8;
  typed_option<float> local_df0;
  typed_option<float> local_d50;
  typed_option<float> local_cb0;
  typed_option<float> local_c10;
  typed_option<float> local_b70;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad0;
  typed_option<float> local_a30;
  typed_option<bool> local_990;
  typed_option<float> local_8f0;
  typed_option<float> local_850;
  typed_option<bool> local_7b0;
  typed_option<float> local_710;
  typed_option<bool> local_670;
  typed_option<bool> local_5d0;
  typed_option<bool> local_530;
  typed_option<bool> local_490;
  typed_option<float> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<bool> local_d0;
  
  bVar16 = 0;
  local_1a60 = options;
  pcVar7 = calloc_or_throw<CB_EXPLORE_ADF::cb_explore_adf>(1);
  local_1a58 = pcVar7;
  memset(pcVar7,0,0x250);
  local_1a61 = false;
  local_1a62 = false;
  local_1a63 = false;
  local_1a48._M_dataplus._M_p = (pointer)&local_1a48.field_2;
  local_1a48.field_2._M_allocated_capacity._0_4_ = 0x737069;
  local_1a48._M_string_length = 3;
  local_1a28._0_8_ = (_func_int **)0x3c;
  local_1988 = local_1978;
  local_1988 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1988,(ulong)local_1a28);
  local_1978[0] = (_func_int **)local_1a28._0_8_;
  builtin_strncpy((char *)((long)local_1988 + 0x2c),"pendent ",8);
  builtin_strncpy((char *)((long)local_1988 + 0x34),"Features",8);
  local_1988[4] = (_func_int **)0x6f69746341206874;
  local_1988[5] = (_func_int **)0x646e65706544206e;
  local_1988[2] = (_func_int **)0x726f6c7078452074;
  local_1988[3] = (_func_int **)0x6977206e6f697461;
  *(undefined4 *)local_1988 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_1988 + 4),"extu",4);
  *(undefined4 *)(local_1988 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_1988 + 0xc),"andi",4);
  local_1980 = (_func_int **)local_1a28._0_8_;
  *(char *)((long)local_1988 + local_1a28._0_8_) = '\0';
  local_15a8.m_name._M_dataplus._M_p = (pointer)&local_15a8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_15a8,local_1988,(char *)(local_1a28._0_8_ + (long)local_1988));
  local_15a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_15a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15a8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1988 != local_1978) {
    operator_delete(local_1988);
  }
  local_15c8._M_dataplus._M_p = (pointer)&local_15c8.field_2;
  local_15c8.field_2._M_allocated_capacity._0_6_ = 0x7078655f6263;
  local_15c8.field_2._M_allocated_capacity._6_2_ = 0x6f6c;
  local_15c8.field_2._8_6_ = 0x6664615f6572;
  local_15c8._M_string_length = 0xe;
  local_15c8.field_2._M_local_buf[0xe] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1a28,&local_15c8,&local_1a61);
  local_19b8 = true;
  local_17a8 = local_1798;
  local_14d0._0_8_ = (_func_int **)0x5f;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_17a8,(ulong)local_14d0);
  uVar5 = local_14d0._0_8_;
  local_1798[0] = (_func_int **)local_14d0._0_8_;
  local_17a8 = __dest;
  memcpy(__dest,
         "Online explore-exploit for a contextual bandit problem with multiline action dependent features"
         ,0x5f);
  local_17a0 = (_func_int **)uVar5;
  *(undefined1 *)((long)__dest + uVar5) = 0;
  std::__cxx11::string::_M_assign((string *)(local_1a28 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_1a28);
  poVar8 = VW::config::option_group_definition::add<bool>(&local_15a8,&local_d0);
  local_15e8._M_dataplus._M_p = (pointer)&local_15e8.field_2;
  local_15e8.field_2._M_allocated_capacity._0_4_ = 0x73726966;
  local_15e8.field_2._M_allocated_capacity._4_2_ = 0x74;
  local_15e8._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_14d0,&local_15e8,&pcVar7->tau);
  local_1460 = true;
  local_17c8 = local_17b8;
  local_e90._0_8_ = (_func_int **)0x15;
  local_17c8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_17c8,(ulong)local_e90)
  ;
  local_17b8[0] = (_func_int **)local_e90._0_8_;
  *local_17c8 = (_func_int **)0x737269662d756174;
  local_17c8[1] = (_func_int **)0x726f6c7078652074;
  builtin_strncpy((char *)((long)local_17c8 + 0xd),"loration",8);
  local_17c0 = (_func_int **)local_e90._0_8_;
  *(char *)((long)local_17c8 + local_e90._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_14d0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_170,(typed_option<unsigned_long> *)local_14d0);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_170);
  local_1608._M_dataplus._M_p = (pointer)&local_1608.field_2;
  local_1608.field_2._M_allocated_capacity._0_4_ = 0x69737065;
  local_1608.field_2._M_allocated_capacity._4_3_ = 0x6e6f6c;
  local_1608._M_string_length = 7;
  local_1608.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_e90,&local_1608,&pcVar7->epsilon);
  local_e20 = true;
  local_17e8 = local_17d8;
  local_f30._0_8_ = (_func_int **)0x1a;
  local_17e8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_17e8,(ulong)local_f30)
  ;
  local_17d8[0] = (_func_int **)local_f30._0_8_;
  builtin_strncpy((char *)((long)local_17e8 + 10),"eedy exp",8);
  builtin_strncpy((char *)((long)local_17e8 + 0x12),"loration",8);
  *local_17e8 = (_func_int **)0x2d6e6f6c69737065;
  local_17e8[1] = (_func_int **)0x6520796465657267;
  local_17e0 = (_func_int **)local_f30._0_8_;
  *(char *)((long)local_17e8 + local_f30._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_210,(typed_option<float> *)local_e90);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_210);
  local_1628._M_dataplus._M_p = (pointer)&local_1628.field_2;
  local_1628.field_2._M_allocated_capacity._0_4_ = 0x676162;
  local_1628._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_f30,&local_1628,&pcVar7->bag_size);
  local_ec0 = true;
  local_1808 = local_17f8;
  local_fd0._0_8_ = (_func_int **)0x19;
  local_1808 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_1808,(ulong)local_fd0)
  ;
  local_17f8[0] = (_func_int **)local_fd0._0_8_;
  builtin_strncpy((char *)((long)local_1808 + 9),"ased exp",8);
  builtin_strncpy((char *)((long)local_1808 + 0x11),"loration",8);
  *local_1808 = (_func_int **)0x2d676e6967676162;
  local_1808[1] = (_func_int **)0x7865206465736162;
  local_1800 = (_func_int **)local_fd0._0_8_;
  *(char *)((long)local_1808 + local_fd0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,(typed_option<unsigned_long> *)local_f30);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_2b0);
  local_1648._M_dataplus._M_p = (pointer)&local_1648.field_2;
  local_1648.field_2._M_allocated_capacity._0_4_ = 0x65766f63;
  local_1648.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_1648._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_fd0,&local_1648,&pcVar7->cover_size);
  local_f60 = true;
  local_1828 = local_1818;
  local_b70.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_1828 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1828,(ulong)&local_b70);
  local_1818[0] = local_b70.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_1828 + 0xe),"ased exp",8);
  builtin_strncpy((char *)((long)local_1828 + 0x16),"loration",8);
  *local_1828 = (_func_int **)0x6320656e696c6e4f;
  local_1828[1] = (_func_int **)0x736162207265766f;
  local_1820 = local_b70.super_base_option._vptr_base_option;
  *(char *)((long)local_1828 + (long)local_b70.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_350,(typed_option<unsigned_long> *)local_fd0);
  poVar8 = VW::config::option_group_definition::add<unsigned_long>(poVar8,&local_350);
  local_1668._M_dataplus._M_p = (pointer)&local_1668.field_2;
  local_1668.field_2._M_allocated_capacity._0_4_ = 0x697370;
  local_1668._M_string_length = 3;
  VW::config::typed_option<float>::typed_option(&local_b70,&local_1668,&pcVar7->psi);
  local_b70.super_base_option.m_keep = true;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_b70,1.0);
  local_1848 = local_1838;
  local_1070._0_8_ = (_func_int **)0x20;
  local_1848 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1848,(ulong)local_1070);
  local_1838[0] = (_func_int **)local_1070._0_8_;
  local_1848[2] = (_func_int **)0x6620726574656d61;
  local_1848[3] = (_func_int **)0x7265766f6320726f;
  *local_1848 = (_func_int **)0x6565726761736964;
  local_1848[1] = (_func_int **)0x72617020746e656d;
  local_1840 = (_func_int **)local_1070._0_8_;
  *(char *)((long)local_1848 + local_1070._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3f0,ptVar9);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_3f0);
  local_1688._M_dataplus._M_p = (pointer)&local_1688.field_2;
  local_1688.field_2._M_allocated_capacity._0_4_ = 0x6e756f6e;
  local_1688.field_2._M_allocated_capacity._4_2_ = 0x6669;
  local_1688._M_string_length = 6;
  local_1688.field_2._M_local_buf[6] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1070,&local_1688,&pcVar7->nounif);
  local_1000 = true;
  local_1868 = local_1858;
  local_1110._0_8_ = (_func_int **)0x3d;
  local_1868 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1868,(ulong)local_1110);
  local_1858[0] = (_func_int **)local_1110._0_8_;
  builtin_strncpy((char *)((long)local_1868 + 0x2d),"actions ",8);
  builtin_strncpy((char *)((long)local_1868 + 0x35),"in cover",8);
  local_1868[4] = (_func_int **)0x696261626f72702d;
  local_1868[5] = (_func_int **)0x746361207974696c;
  local_1868[2] = (_func_int **)0x796c6d726f66696e;
  local_1868[3] = (_func_int **)0x6f72657a206e6f20;
  *local_1868 = (_func_int **)0x6520746f6e206f64;
  local_1868[1] = (_func_int **)0x752065726f6c7078;
  local_1860 = (_func_int **)local_1110._0_8_;
  *(char *)((long)local_1868 + local_1110._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_490,(typed_option<bool> *)local_1070);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_490);
  local_16a8._M_dataplus._M_p = (pointer)&local_16a8.field_2;
  local_16a8.field_2._M_allocated_capacity._0_4_ = 0x74666f73;
  local_16a8.field_2._M_allocated_capacity._4_3_ = 0x78616d;
  local_16a8._M_string_length = 7;
  local_16a8.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1110,&local_16a8,&local_1a62);
  local_10a0 = true;
  local_1888 = local_1878;
  local_11b0._0_8_ = (_func_int **)0x13;
  local_1888 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1888,(ulong)local_11b0);
  local_1878[0] = (_func_int **)local_11b0._0_8_;
  *local_1888 = (_func_int **)0x2078616d74666f73;
  local_1888[1] = (_func_int **)0x7461726f6c707865;
  builtin_strncpy((char *)((long)local_1888 + 0xf),"tion",4);
  local_1880 = (_func_int **)local_11b0._0_8_;
  *(char *)((long)local_1888 + local_11b0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1110 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_530,(typed_option<bool> *)local_1110);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_530);
  local_16c8._M_dataplus._M_p = (pointer)&local_16c8.field_2;
  local_16c8.field_2._M_allocated_capacity._0_4_ = 0x63676572;
  local_16c8.field_2._M_allocated_capacity._4_2_ = 0x62;
  local_16c8._M_string_length = 5;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_11b0,&local_16c8,&local_1a63);
  local_1140 = true;
  local_18a8 = local_1898;
  local_1250._0_8_ = (_func_int **)0x16;
  local_18a8 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_18a8,(ulong)local_1250);
  local_1898[0] = (_func_int **)local_1250._0_8_;
  *local_18a8 = (_func_int **)0x6c652d4243676552;
  local_18a8[1] = (_func_int **)0x6f6c707865206d69;
  builtin_strncpy((char *)((long)local_18a8 + 0xe),"loration",8);
  local_18a0 = (_func_int **)local_1250._0_8_;
  *(char *)((long)local_18a8 + local_1250._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_11b0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_5d0,(typed_option<bool> *)local_11b0);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_5d0);
  local_16e8._M_dataplus._M_p = (pointer)&local_16e8.field_2;
  local_16e8.field_2._M_allocated_capacity = 0x74706f6263676572;
  local_16e8._M_string_length = 8;
  local_16e8.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1250,&local_16e8,&pcVar7->regcbopt);
  local_11e0 = true;
  local_18c8 = local_18b8;
  local_c10.super_base_option._vptr_base_option = (_func_int **)0x1c;
  local_18c8 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_18c8,(ulong)&local_c10);
  local_18b8[0] = local_c10.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_18c8 + 0xc),"stic exp",8);
  builtin_strncpy((char *)((long)local_18c8 + 0x14),"loration",8);
  *local_18c8 = (_func_int **)0x706f204243676552;
  local_18c8[1] = (_func_int **)0x63697473696d6974;
  local_18c0 = local_c10.super_base_option._vptr_base_option;
  *(char *)((long)local_18c8 + (long)local_c10.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1250 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_670,(typed_option<bool> *)local_1250);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_670);
  local_1708._M_dataplus._M_p = (pointer)&local_1708.field_2;
  local_1708.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_1708.field_2._8_2_ = 0x7373;
  local_1708._M_string_length = 10;
  local_1708.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_c10,&local_1708,&pcVar7->c0);
  local_c10.super_base_option.m_keep = true;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_c10,0.1);
  local_18e8 = local_18d8;
  local_12f0._0_8_ = (_func_int **)0x2b;
  local_18e8 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_18e8,(ulong)local_12f0);
  local_18d8[0] = (_func_int **)local_12f0._0_8_;
  builtin_strncpy((char *)((long)local_18e8 + 0x1b),"c_0. Def",8);
  builtin_strncpy((char *)((long)local_18e8 + 0x23),"ault 0.1",8);
  local_18e8[2] = (_func_int **)0x74656d6172617020;
  local_18e8[3] = (_func_int **)0x202e305f63207265;
  *local_18e8 = (_func_int **)0x656d204243676552;
  local_18e8[1] = (_func_int **)0x7373656e776f6c6c;
  local_18e0 = (_func_int **)local_12f0._0_8_;
  *(char *)((long)local_18e8 + local_12f0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_710,ptVar9);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_710);
  local_1728._M_dataplus._M_p = (pointer)&local_1728.field_2;
  local_1728.field_2._M_allocated_capacity = 0x7966696465657267;
  local_1728._M_string_length = 8;
  local_1728.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_12f0,&local_1728,&pcVar7->greedify);
  local_1280 = true;
  local_1908 = local_18f8;
  local_cb0.super_base_option._vptr_base_option = (_func_int **)0x2a;
  local_1908 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1908,(ulong)&local_cb0);
  local_18f8[0] = local_cb0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_1908 + 0x1a)," once in",8);
  builtin_strncpy((char *)((long)local_1908 + 0x22)," bagging",8);
  local_1908[2] = (_func_int **)0x696c6f7020747372;
  local_1908[3] = (_func_int **)0x2065636e6f207963;
  *local_1908 = (_func_int **)0x7520737961776c61;
  local_1908[1] = (_func_int **)0x6966206574616470;
  local_1900 = local_cb0.super_base_option._vptr_base_option;
  *(char *)((long)local_1908 + (long)local_cb0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_12f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)local_12f0);
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_7b0);
  local_1748._M_dataplus._M_p = (pointer)&local_1748.field_2;
  local_1748.field_2._M_allocated_capacity._0_7_ = 0x5f6e696d5f6263;
  local_1748.field_2._7_4_ = 0x74736f63;
  local_1748._M_string_length = 0xb;
  local_1748.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<float>::typed_option(&local_cb0,&local_1748,&pcVar7->min_cb_cost);
  local_cb0.super_base_option.m_keep = true;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_cb0,0.0);
  local_1928 = local_1918;
  local_d50.super_base_option._vptr_base_option = (_func_int **)0x13;
  local_1928 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1928,(ulong)&local_d50);
  local_1918[0] = local_d50.super_base_option._vptr_base_option;
  *local_1928 = (_func_int **)0x6f62207265776f6c;
  local_1928[1] = (_func_int **)0x63206e6f20646e75;
  builtin_strncpy((char *)((long)local_1928 + 0xf),"cost",4);
  local_1920 = local_d50.super_base_option._vptr_base_option;
  *(char *)((long)local_1928 + (long)local_d50.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_850,ptVar9);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_850);
  local_1768._M_dataplus._M_p = (pointer)&local_1768.field_2;
  local_1768.field_2._M_allocated_capacity._0_7_ = 0x5f78616d5f6263;
  local_1768.field_2._7_4_ = 0x74736f63;
  local_1768._M_string_length = 0xb;
  local_1768.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<float>::typed_option(&local_d50,&local_1768,&pcVar7->max_cb_cost);
  local_d50.super_base_option.m_keep = true;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_d50,1.0);
  local_1948 = local_1938;
  local_1390._0_8_ = (_func_int **)0x13;
  local_1948 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1948,(ulong)local_1390);
  local_1938[0] = (_func_int **)local_1390._0_8_;
  *local_1948 = (_func_int **)0x6f62207265707075;
  local_1948[1] = (_func_int **)0x63206e6f20646e75;
  builtin_strncpy((char *)((long)local_1948 + 0xf),"cost",4);
  local_1940 = (_func_int **)local_1390._0_8_;
  *(char *)((long)local_1948 + local_1390._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_8f0,ptVar9);
  local_1a50 = all;
  local_1968 = &pcVar7->epsilon;
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_8f0);
  local_1788._M_dataplus._M_p = (pointer)&local_1788.field_2;
  local_1788.field_2._M_allocated_capacity = 0x6e6f5f7473726966;
  local_1788.field_2._8_2_ = 0x796c;
  local_1788._M_string_length = 10;
  local_1788.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1390,&local_1788,&pcVar7->first_only);
  local_1320 = true;
  local_df0.super_base_option._vptr_base_option = (_func_int **)0x35;
  local_1530 = local_1520;
  local_1530 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1530,(ulong)&local_df0);
  local_1520[0] = local_df0.super_base_option._vptr_base_option;
  local_1530[4] = (_func_int **)0x622d656974206120;
  local_1530[5] = (_func_int **)0x20676e696b616572;
  local_1530[2] = (_func_int **)0x6120747372696620;
  local_1530[3] = (_func_int **)0x6e69206e6f697463;
  *local_1530 = (_func_int **)0x70786520796c6e4f;
  local_1530[1] = (_func_int **)0x6568742065726f6c;
  builtin_strncpy((char *)((long)local_1530 + 0x2d),"ng event",8);
  local_1528 = local_df0.super_base_option._vptr_base_option;
  *(char *)((long)local_1530 + (long)local_df0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1390 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_990,(typed_option<bool> *)local_1390);
  local_1960 = &pcVar7->regcbopt;
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_990);
  local_14f0.field_2._M_allocated_capacity._0_4_ = 0x626d616c;
  local_14f0.field_2._M_allocated_capacity._4_2_ = 0x6164;
  local_14f0._M_string_length = 6;
  local_14f0.field_2._M_local_buf[6] = '\0';
  local_14f0._M_dataplus._M_p = (pointer)&local_14f0.field_2;
  VW::config::typed_option<float>::typed_option(&local_df0,&local_14f0,&pcVar7->lambda);
  local_df0.super_base_option.m_keep = true;
  local_1958 = &pcVar7->lambda;
  ptVar9 = VW::config::typed_option<float>::default_value(&local_df0,-1.0);
  local_1430._0_8_ = (_func_int **)0x15;
  local_1550 = local_1540;
  local_1550 = (_func_int ***)
               std::__cxx11::string::_M_create((ulong *)&local_1550,(ulong)local_1430);
  local_1540[0] = (_func_int **)local_1430._0_8_;
  *local_1550 = (_func_int **)0x6574656d61726170;
  local_1550[1] = (_func_int **)0x6f7320726f662072;
  builtin_strncpy((char *)((long)local_1550 + 0xd)," softmax",8);
  local_1548 = (_func_int **)local_1430._0_8_;
  *(char *)((long)local_1550 + local_1430._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_a30,ptVar9);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_a30);
  local_1510.field_2._M_allocated_capacity._0_4_ = 0x745f6263;
  local_1510.field_2._M_allocated_capacity._4_3_ = 0x657079;
  local_1510._M_string_length = 7;
  local_1510.field_2._M_local_buf[7] = '\0';
  local_1510._M_dataplus._M_p = (pointer)&local_1510.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1430,&local_1510,&local_1a48);
  local_13c0 = true;
  local_1950 = 0x2e;
  local_1570 = local_1560;
  local_1570 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1570,(ulong)&local_1950);
  local_1560[0] = local_1950;
  builtin_strncpy((char *)((long)local_1570 + 0x1e),"e in {ip",8);
  builtin_strncpy((char *)((long)local_1570 + 0x26),"s,dm,dr}",8);
  local_1570[2] = 0x646f6874656d2074;
  local_1570[3] = 0x20657375206f7420;
  *local_1570 = 0x75747865746e6f63;
  local_1570[1] = 0x69646e6162206c61;
  local_1568 = local_1950;
  *(char *)((long)local_1570 + local_1950) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_1430 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_ad0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1430);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar8,&local_ad0);
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_ad0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_ad0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if (local_1570 != local_1560) {
    operator_delete(local_1570);
  }
  local_1430._0_8_ = &PTR__typed_option_002d4190;
  if (local_1398._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1398._M_pi);
  }
  if (local_13a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_13a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1510._M_dataplus._M_p != &local_1510.field_2) {
    operator_delete(local_1510._M_dataplus._M_p);
  }
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_a30.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a30.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if (local_1550 != local_1540) {
    operator_delete(local_1550);
  }
  pfVar4 = local_1958;
  local_df0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_df0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_df0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_df0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
    operator_delete(local_14f0._M_dataplus._M_p);
  }
  local_990.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_990.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_990.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_990.super_base_option);
  if (local_1530 != local_1520) {
    operator_delete(local_1530);
  }
  local_1390._0_8_ = &PTR__typed_option_002d4128;
  if (local_12f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_12f8._M_pi);
  }
  if (local_1308._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1308._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1788._M_dataplus._M_p != &local_1788.field_2) {
    operator_delete(local_1788._M_dataplus._M_p);
  }
  all_00 = local_1a50;
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_8f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if (local_1948 != local_1938) {
    operator_delete(local_1948);
  }
  local_d50.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_d50.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d50.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d50.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1768._M_dataplus._M_p != &local_1768.field_2) {
    operator_delete(local_1768._M_dataplus._M_p);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_1928 != local_1918) {
    operator_delete(local_1928);
  }
  local_cb0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_cb0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_cb0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_cb0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1748._M_dataplus._M_p != &local_1748.field_2) {
    operator_delete(local_1748._M_dataplus._M_p);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_1908 != local_18f8) {
    operator_delete(local_1908);
  }
  local_12f0._0_8_ = &PTR__typed_option_002d4128;
  if (local_1258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1258._M_pi);
  }
  if (local_1268._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1268._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1728._M_dataplus._M_p != &local_1728.field_2) {
    operator_delete(local_1728._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_18e8 != local_18d8) {
    operator_delete(local_18e8);
  }
  local_c10.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_c10.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1708._M_dataplus._M_p != &local_1708.field_2) {
    operator_delete(local_1708._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_18c8 != local_18b8) {
    operator_delete(local_18c8);
  }
  local_1250._0_8_ = &PTR__typed_option_002d4128;
  if (local_11b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11b8._M_pi);
  }
  if (local_11c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16e8._M_dataplus._M_p != &local_16e8.field_2) {
    operator_delete(local_16e8._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_5d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_18a8 != local_1898) {
    operator_delete(local_18a8);
  }
  local_11b0._0_8_ = &PTR__typed_option_002d4128;
  if (local_1118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1118._M_pi);
  }
  if (local_1128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1128._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_11b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16c8._M_dataplus._M_p != &local_16c8.field_2) {
    operator_delete(local_16c8._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_1888 != local_1878) {
    operator_delete(local_1888);
  }
  local_1110._0_8_ = &PTR__typed_option_002d4128;
  if (local_1078._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1078._M_pi);
  }
  if (local_1088._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1088._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a8._M_dataplus._M_p != &local_16a8.field_2) {
    operator_delete(local_16a8._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_490.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_1868 != local_1858) {
    operator_delete(local_1868);
  }
  local_1070._0_8_ = &PTR__typed_option_002d4128;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd8._M_pi);
  }
  if (local_fe8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fe8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1070);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1688._M_dataplus._M_p != &local_1688.field_2) {
    operator_delete(local_1688._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_1848 != local_1838) {
    operator_delete(local_1848);
  }
  local_b70.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_b70.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b70.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_b70.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1668._M_dataplus._M_p != &local_1668.field_2) {
    operator_delete(local_1668._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d41c8;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_1828 != local_1818) {
    operator_delete(local_1828);
  }
  local_fd0._0_8_ = &PTR__typed_option_002d41c8;
  if (local_f38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f38._M_pi);
  }
  if (local_f48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1648._M_dataplus._M_p != &local_1648.field_2) {
    operator_delete(local_1648._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d41c8;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_1808 != local_17f8) {
    operator_delete(local_1808);
  }
  local_f30._0_8_ = &PTR__typed_option_002d41c8;
  if (local_e98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e98._M_pi);
  }
  if (local_ea8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ea8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1628._M_dataplus._M_p != &local_1628.field_2) {
    operator_delete(local_1628._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4270;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_17e8 != local_17d8) {
    operator_delete(local_17e8);
  }
  local_e90._0_8_ = &PTR__typed_option_002d4270;
  if (local_df8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_df8._M_pi);
  }
  pcVar7 = local_1a58;
  if (local_e08._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e08._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_e90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1608._M_dataplus._M_p != &local_1608.field_2) {
    operator_delete(local_1608._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d41c8;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_17c8 != local_17b8) {
    operator_delete(local_17c8);
  }
  local_14d0._0_8_ = &PTR__typed_option_002d41c8;
  if (local_1438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1438._M_pi);
  }
  if (local_1448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1448._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15e8._M_dataplus._M_p != &local_15e8.field_2) {
    operator_delete(local_15e8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_17a8 != local_1798) {
    operator_delete(local_17a8);
  }
  local_1a28._0_8_ = &PTR__typed_option_002d4128;
  if (local_1990._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1990._M_pi);
  }
  if (local_19a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_19a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1a28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15c8._M_dataplus._M_p != &local_15c8.field_2) {
    operator_delete(local_15c8._M_dataplus._M_p);
  }
  (**local_1a60->_vptr_options_i)(local_1a60,&local_15a8);
  if (local_1a61 == false) {
    plVar11 = (learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
               *)0x0;
    goto LAB_00205d33;
  }
  pp_Var2 = (_func_int **)(local_1a28 + 0x10);
  local_1a28._8_8_ = (pointer)0x7;
  local_1a28._16_8_ = 0x657079745f6263;
  local_1a28._0_8_ = pp_Var2;
  iVar6 = (*local_1a60->_vptr_options_i[1])(local_1a60,local_1a28);
  if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
    operator_delete((void *)local_1a28._0_8_);
  }
  pcVar7 = local_1a58;
  if ((char)iVar6 == '\0') {
    local_1a28._8_8_ = (pointer)0x7;
    local_1a28._16_8_ = 0x657079745f6263;
    local_1a28._0_8_ = pp_Var2;
    (*local_1a60->_vptr_options_i[5])(local_1a60,local_1a28,&local_1a48);
    if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a28._0_8_);
    }
    (**local_1a60->_vptr_options_i)(local_1a60,&local_15a8);
  }
  pcVar7->all = all_00;
  fVar3 = pcVar7->lambda;
  if (0.0 < fVar3) {
    *pfVar4 = -fVar3;
  }
  local_1a28._8_8_ = (pointer)0x6;
  local_1a28._16_7_ = 0x6664615f6263;
  local_1a28._0_8_ = pp_Var2;
  iVar6 = (*local_1a60->_vptr_options_i[1])();
  if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
    operator_delete((void *)local_1a28._0_8_);
  }
  if ((char)iVar6 == '\0') {
    local_1a28._8_8_ = (pointer)0x6;
    local_1a28._16_7_ = 0x6664615f6263;
    local_14d0._8_8_ = (pointer)0x0;
    local_14d0._16_4_ = local_14d0._16_4_ & 0xffffff00;
    local_1a28._0_8_ = pp_Var2;
    local_14d0._0_8_ = local_14d0 + 0x10;
    (*local_1a60->_vptr_options_i[5])(local_1a60,local_1a28,local_14d0);
    if ((undefined1 *)local_14d0._0_8_ != local_14d0 + 0x10) {
      operator_delete((void *)local_14d0._0_8_);
    }
    if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a28._0_8_);
    }
  }
  all_00->delete_prediction = ACTION_SCORE::delete_action_scores;
  local_1a28._16_6_ = 0x7265766f63;
  local_1a28._8_8_ = (pointer)0x5;
  local_1a28._0_8_ = pp_Var2;
  iVar6 = (*local_1a60->_vptr_options_i[1])();
  if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
    operator_delete((void *)local_1a28._0_8_);
  }
  if ((char)iVar6 == '\0') {
    local_1a28._16_4_ = 0x676162;
    local_1a28._8_8_ = (pointer)0x3;
    local_1a28._0_8_ = pp_Var2;
    iVar6 = (*local_1a60->_vptr_options_i[1])();
    if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a28._0_8_);
    }
    if ((char)iVar6 == '\0') {
      local_1a28._16_6_ = 0x7473726966;
      local_1a28._8_8_ = (pointer)0x5;
      local_1a28._0_8_ = pp_Var2;
      iVar6 = (*local_1a60->_vptr_options_i[1])();
      if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a28._0_8_);
      }
      if ((char)iVar6 == '\0') {
        if (local_1a62 == true) {
          local_1a58->explore_type = 3;
        }
        else {
          if (local_1a63 == false) {
            local_1a28._16_8_ = 0x74706f6263676572;
            local_1a28._8_8_ = (pointer)0x8;
            local_1a28[0x18] = '\0';
            local_1a28._0_8_ = pp_Var2;
            iVar6 = (*local_1a60->_vptr_options_i[1])();
            if ((char)iVar6 == '\0') {
              cVar13 = '\0';
            }
            else {
              cVar13 = *local_1960;
            }
            if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
              operator_delete((void *)local_1a28._0_8_);
            }
            if (cVar13 == '\0') {
              local_1a28._8_8_ = (pointer)0x7;
              local_1a28._16_8_ = 0x6e6f6c69737065;
              local_1a28._0_8_ = pp_Var2;
              iVar6 = (*local_1a60->_vptr_options_i[1])();
              if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
                operator_delete((void *)local_1a28._0_8_);
              }
              if ((char)iVar6 == '\0') {
                *local_1968 = 0.05;
              }
              local_1a58->explore_type = 1;
              goto LAB_00205a3b;
            }
          }
          local_1a58->explore_type = 5;
        }
      }
      else {
        local_1a58->explore_type = 0;
      }
LAB_00205a3b:
      ws = 1;
    }
    else {
      local_1a58->explore_type = 2;
      ws = local_1a58->bag_size;
    }
  }
  else {
    local_1a58->explore_type = 4;
    ws = local_1a58->cover_size + 1;
  }
  (local_1a58->gen_cs).cb_type = 2;
  local_1a28._8_8_ = (pointer)0x7;
  local_1a28._16_8_ = 0x657079745f6263;
  local_1a28._0_8_ = pp_Var2;
  iVar6 = (*local_1a60->_vptr_options_i[1])();
  if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
    operator_delete((void *)local_1a28._0_8_);
  }
  pcVar7 = local_1a58;
  if ((char)iVar6 != '\0') {
    iVar6 = std::__cxx11::string::compare((char *)&local_1a48);
    if (iVar6 == 0) {
      (pcVar7->gen_cs).cb_type = 0;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_1a48);
      if (iVar6 == 0) {
        (pcVar7->gen_cs).cb_type = 2;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_1a48);
        if (iVar6 == 0) {
          local_1a28._16_6_ = 0x7265766f63;
          local_1a28._8_8_ = (pointer)0x5;
          local_1a28._0_8_ = pp_Var2;
          iVar6 = (*local_1a60->_vptr_options_i[1])();
          if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
            operator_delete((void *)local_1a28._0_8_);
          }
          pcVar7 = local_1a58;
          if ((char)iVar6 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&(all_00->trace_message).super_ostream,
                       "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                       ,0x59);
            std::endl<char,std::char_traits<char>>(&(all_00->trace_message).super_ostream);
          }
          (pcVar7->gen_cs).cb_type = 3;
        }
        else {
          pvVar1 = &all_00->trace_message;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pvVar1->super_ostream,
                     "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\'}; resetting to ips.",0x41)
          ;
          std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
          std::ostream::put((char)pvVar1);
          std::ostream::flush();
          local_1a28._8_8_ = (pointer)0x7;
          local_1a28._16_8_ = 0x657079745f6263;
          local_14d0._16_4_ = 0x737069;
          local_14d0._8_8_ = (pointer)0x3;
          local_1a28._0_8_ = pp_Var2;
          local_14d0._0_8_ = local_14d0 + 0x10;
          (*local_1a60->_vptr_options_i[6])(local_1a60,local_1a28,local_14d0);
          if ((undefined1 *)local_14d0._0_8_ != local_14d0 + 0x10) {
            operator_delete((void *)local_14d0._0_8_);
          }
          if ((_func_int **)local_1a28._0_8_ != pp_Var2) {
            operator_delete((void *)local_1a28._0_8_);
          }
        }
      }
    }
    if ((pcVar7->explore_type == 5) && ((pcVar7->gen_cs).cb_type != 3)) {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"warning: bad cb_type, RegCB only supports mtr!",0x2e);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
  }
  l = setup_base(local_1a60,all_00);
  base = LEARNER::as_multiline<char,char>(l);
  ppuVar14 = &CB::cb_label;
  plVar15 = &local_1a50->p->lp;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    plVar15->default_label = (_func_void_void_ptr *)*ppuVar14;
    ppuVar14 = ppuVar14 + (ulong)bVar16 * -2 + 1;
    plVar15 = (label_parser *)((long)plVar15 + (ulong)bVar16 * -0x10 + 8);
  }
  local_1a50->label_type = cb;
  (pcVar7->gen_cs).scorer = local_1a50->scorer;
  pmVar10 = LEARNER::as_multiline<char,char>(local_1a50->cost_sensitive);
  pcVar7->cs_ldf_learner = pmVar10;
  plVar11 = LEARNER::
            learner<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>>::
            init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                      (pcVar7,base,CB_EXPLORE_ADF::do_actual_learning<true>,
                       CB_EXPLORE_ADF::do_actual_learning<false>,ws,action_probs);
  *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
  *(code **)(plVar11 + 0x68) = CB_EXPLORE_ADF::finish_multiline_example;
  *(undefined8 *)(plVar11 + 0xb8) = *(undefined8 *)(plVar11 + 0x18);
  *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
  *(code **)(plVar11 + 200) = CB_EXPLORE_ADF::finish;
  pcVar7 = (cb_explore_adf *)0x0;
LAB_00205d33:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_15a8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15a8.m_name._M_dataplus._M_p != &local_15a8.m_name.field_2) {
    operator_delete(local_15a8.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a48._M_dataplus._M_p != &local_1a48.field_2) {
    operator_delete(local_1a48._M_dataplus._M_p);
  }
  if (pcVar7 != (cb_explore_adf *)0x0) {
    destroy_free<CB_EXPLORE_ADF::cb_explore_adf>(pcVar7);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* cb_explore_adf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore_adf>();
  bool cb_explore_adf_option = false;
  bool softmax = false;
  bool regcb = false;
  std::string type_string = "ips";
  option_group_definition new_options("Contextual Bandit Exploration with Action Dependent Features");
  new_options
      .add(make_option("cb_explore_adf", cb_explore_adf_option)
               .keep()
               .help("Online explore-exploit for a contextual bandit problem with multiline action dependent features"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"))
      .add(make_option("nounif", data->nounif)
               .keep()
               .help("do not explore uniformly on zero-probability actions in cover"))
      .add(make_option("softmax", softmax).keep().help("softmax exploration"))
      .add(make_option("regcb", regcb).keep().help("RegCB-elim exploration"))
      .add(make_option("regcbopt", data->regcbopt).keep().help("RegCB optimistic exploration"))
      .add(make_option("mellowness", data->c0)
               .keep()
               .default_value(0.1f)
               .help("RegCB mellowness parameter c_0. Default 0.1"))
      .add(make_option("greedify", data->greedify).keep().help("always update first policy once in bagging"))
      .add(make_option("cb_min_cost", data->min_cb_cost).keep().default_value(0.f).help("lower bound on cost"))
      .add(make_option("cb_max_cost", data->max_cb_cost).keep().default_value(1.f).help("upper bound on cost"))
      .add(make_option("first_only", data->first_only)
               .keep()
               .help("Only explore the first action in a tie-breaking event"))
      .add(make_option("lambda", data->lambda).keep().default_value(-1.f).help("parameter for softmax"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips,dm,dr}"));
  options.add_and_parse(new_options);

  if (!cb_explore_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  data->all = &all;
  if (data->lambda > 0)  // Lambda should always be negative because we are using a cost basis.
    data->lambda = -data->lambda;

  if (!options.was_supplied("cb_adf"))
  {
    options.insert("cb_adf", "");
  }

  all.delete_prediction = delete_action_scores;

  size_t problem_multiplier = 1;

  if (options.was_supplied("cover"))
  {
    data->explore_type = COVER;
    problem_multiplier = data->cover_size + 1;
  }
  else if (options.was_supplied("bag"))
  {
    data->explore_type = BAG_EXPLORE;
    problem_multiplier = data->bag_size;
  }
  else if (options.was_supplied("first"))
    data->explore_type = EXPLORE_FIRST;
  else if (softmax)
    data->explore_type = SOFTMAX;
  else if (regcb || (options.was_supplied("regcbopt") && data->regcbopt))
    data->explore_type = REGCB;
  else
  {
    if (!options.was_supplied("epsilon"))
      data->epsilon = 0.05f;
    data->explore_type = EPS_GREEDY;
  }

  data->gen_cs.cb_type = CB_TYPE_IPS;
  if (options.was_supplied("cb_type"))
  {
    if (type_string.compare("dr") == 0)
      data->gen_cs.cb_type = CB_TYPE_DR;
    else if (type_string.compare("ips") == 0)
      data->gen_cs.cb_type = CB_TYPE_IPS;
    else if (type_string.compare("mtr") == 0)
    {
      if (options.was_supplied("cover"))
        all.trace_message << "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                          << endl;
      data->gen_cs.cb_type = CB_TYPE_MTR;
    }
    else
    {
      all.trace_message << "warning: cb_type must be in {'ips','dr','mtr'}; resetting to ips." << std::endl;
      options.replace("cb_type", "ips");
    }

    if (data->explore_type == REGCB && data->gen_cs.cb_type != CB_TYPE_MTR)
      all.trace_message << "warning: bad cb_type, RegCB only supports mtr!" << std::endl;
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  // Extract from lower level reductions.
  data->gen_cs.scorer = all.scorer;
  data->cs_ldf_learner = as_multiline(all.cost_sensitive);

  learner<cb_explore_adf, multi_ex>& l = init_learner(data, base, CB_EXPLORE_ADF::do_actual_learning<true>,
      CB_EXPLORE_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_probs);

  l.set_finish_example(CB_EXPLORE_ADF::finish_multiline_example);
  l.set_finish(CB_EXPLORE_ADF::finish);
  return make_base(l);
}